

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.c
# Opt level: O2

int main(int argc,char **argv)

{
  option *__filename;
  seqdiff_results_t *results;
  int iVar1;
  size_t sVar2;
  option *poVar3;
  FILE *pFVar4;
  char *pcVar5;
  option *unaff_R12;
  size_t sStack_80;
  int local_70;
  int local_6c;
  option *local_68;
  option *local_60;
  option *local_58;
  int option_index;
  option *local_48;
  option *local_40;
  seqdiff_results_t *local_38;
  
  local_38 = seqdiff_results_init();
  verbose_flag = 0;
  progname = *argv;
  if (argc < 2) {
switchD_001014a7_caseD_68:
    show_usage(1);
LAB_001018e5:
    fprintf(_stderr,"%s - failed to open file %s\n",progname,unaff_R12);
    exit(1);
  }
  local_60 = (option *)0x0;
  unaff_R12 = main::long_options;
  local_68 = (option *)0x0;
  local_40 = (option *)0x0;
  local_48 = (option *)0x0;
  local_58 = (option *)0x0;
  local_6c = 0;
  local_70 = 0;
LAB_0010143a:
  option_index = 0;
  iVar1 = getopt_long(argc,argv,"vVh?sd1:2:a:b:c:",main::long_options,&option_index);
  __filename = local_40;
  poVar3 = local_48;
  pcVar5 = _optarg;
  switch(iVar1) {
  case 0x61:
    sVar2 = strlen(_optarg);
    poVar3 = (option *)malloc(sVar2 + 1);
    local_40 = poVar3;
    break;
  case 0x62:
    sVar2 = strlen(_optarg);
    poVar3 = (option *)malloc(sVar2 + 1);
    local_60 = poVar3;
    break;
  case 99:
    sVar2 = strlen(_optarg);
    poVar3 = (option *)malloc(sVar2 + 1);
    local_68 = poVar3;
    break;
  case 100:
    local_6c = 1;
    goto LAB_0010143a;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_001014a7_caseD_65:
    abort();
  case 0x68:
    goto switchD_001014a7_caseD_68;
  default:
    if (iVar1 == 0x31) {
      sVar2 = strlen(_optarg);
      poVar3 = (option *)malloc(sVar2 + 1);
      local_58 = poVar3;
      break;
    }
    if (iVar1 == 0x32) {
      sVar2 = strlen(_optarg);
      poVar3 = (option *)malloc(sVar2 + 1);
      local_48 = poVar3;
      break;
    }
    if (iVar1 != 0x3f) {
      if (iVar1 == 0x56) {
        printf("Version is %f\n",0x3fb999999999999a);
      }
      else if (iVar1 == 0x73) {
        local_70 = 1;
      }
      else {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            if (verbose_flag != 0) {
              fwrite("verbose flag is set\n",0x14,1,_stderr);
              fprintf(_stderr,"First file is %s\n",local_58);
              fprintf(_stderr,"Second file is %s\n",poVar3);
              if (__filename == (option *)0x0) {
                fwrite("No output files will be generated\n",0x22,1,_stderr);
              }
              else {
                fwrite("Output will be written to files:\n",0x21,1,_stderr);
                fprintf(_stderr,"  first file uniques: %s\n",__filename);
                fprintf(_stderr,"  second file uniques: %s\n",local_60);
                fprintf(_stderr,"  common to both input files: %s\n",local_68);
              }
              if (local_6c == 0) {
                pcVar5 = "Processing will be done using sequences\n";
                sStack_80 = 0x28;
              }
              else {
                pcVar5 = "Processing will be done using headers, not sequences\n";
                sStack_80 = 0x35;
              }
              fwrite(pcVar5,sStack_80,1,_stderr);
              if (local_70 != 0) {
                fwrite("Only showing summary information\n",0x21,1,_stderr);
              }
            }
            results = local_38;
            if ((local_58 == (option *)0x0) || (poVar3 == (option *)0x0)) {
              fwrite("Error: First sequence file is required.\n",0x28,1,_stderr);
              iVar1 = 1;
            }
            else {
              local_38->first_file = (char *)local_58;
              local_38->second_file = (char *)poVar3;
              local_38->use_header = local_6c;
              local_38->only_summarize = local_70;
              if (((__filename == (option *)0x0) || (local_60 == (option *)0x0)) ||
                 (local_68 == (option *)0x0)) {
                cmpseq(local_38);
              }
              else {
                pFVar4 = fopen((char *)__filename,"w+");
                results->a_output_fp = (FILE *)pFVar4;
                unaff_R12 = __filename;
                if (pFVar4 == (FILE *)0x0) goto LAB_001018e5;
                pFVar4 = fopen((char *)local_60,"w+");
                results->b_output_fp = (FILE *)pFVar4;
                unaff_R12 = local_60;
                if (pFVar4 == (FILE *)0x0) goto LAB_001018e5;
                pFVar4 = fopen((char *)local_68,"w+");
                results->c_output_fp = (FILE *)pFVar4;
                unaff_R12 = local_68;
                if (pFVar4 == (FILE *)0x0) goto LAB_001018e5;
                cmpseq(results);
                fclose((FILE *)results->a_output_fp);
                fclose((FILE *)results->b_output_fp);
                fclose((FILE *)results->c_output_fp);
              }
              iVar1 = 0;
              fprintf(_stderr," first_file_total = %d\n",(ulong)(uint)results->first_file_total);
              fprintf(_stderr,"  first_file_uniq = %d\n",(ulong)(uint)results->first_file_uniq);
              fprintf(_stderr,"second_file_total = %d\n",(ulong)(uint)results->second_file_total);
              fprintf(_stderr," second_file_uniq = %d\n",(ulong)(uint)results->second_file_uniq);
              fprintf(_stderr,"           common = %d\n",(ulong)(uint)results->common);
              free(local_58);
              free(poVar3);
              free(__filename);
              free(local_60);
              free(local_68);
              seqdiff_results_destroy(results);
              fclose(_stderr);
              fclose(_stdout);
              fclose(_stdin);
            }
            return iVar1;
          }
          goto switchD_001014a7_caseD_65;
        }
        verbose_flag = 1;
      }
    }
    goto LAB_0010143a;
  }
  strcpy((char *)poVar3,pcVar5);
  goto LAB_0010143a;
}

Assistant:

int main(int argc, char *argv[]) {
	int c;                          /* character for getopt processing */
	/* command argument variables */
	char *first_file = NULL;
	char *second_file = NULL;
	char *a_output_file = NULL;
	char *b_output_file = NULL;
	char *c_output_file = NULL;
	FILE *a_output_fp = NULL;
	FILE *b_output_fp = NULL;
	FILE *c_output_fp = NULL;
	int use_header = 0;
	int only_summarize = 0;

	/* internal variables */
	seqdiff_results_t *results;
	results = seqdiff_results_init();

	extern char *optarg; /* external from getopt */

	verbose_flag = 0; /* assume not verbose */
	progname = argv[0]; /* capture the program name */
	if (argc < 2) {
		show_usage(EXIT_FAILURE);
	}

	while(1) {
		static struct option long_options[] =
		{
			{"verbose",    no_argument, 0, 'v'},
			{"version",    no_argument, 0, 'V'},
			{"help",       no_argument, 0, 'h'},
			{"summary",    no_argument, 0, 's'},
			{"headers",    no_argument, 0, 'd'},
			{"first",      required_argument, 0, '1'},
			{"second",     required_argument, 0, '2'},
			{"a_output",   required_argument, 0, 'a'},
			{"b_output",   required_argument, 0, 'b'},
			{"c_output",   required_argument, 0, 'c'},
			{0, 0, 0, 0}
		};

		/* getopt_long stores the option index here. */
		int option_index = 0;

		c = getopt_long(argc, argv, "vVh?sd1:2:a:b:c:", long_options, &option_index);

		/* Detect the end of the options. */
		if (c == -1)
			break;

		switch (c) {
			case 'v':
				verbose_flag = 1;
				break;

			case 'V':
				/* version */
				printf("Version is %f\n",VERSION);
				break;

			case 'h':
				show_usage(EXIT_FAILURE);
				break;

			case '?':
				/* getopt_long already printed an error message. */
				break;

			case 's':
				only_summarize = 1;
				break;

			case 'd':
				use_header = 1;
				break;

			case '1':
				first_file = (char*) malloc(strlen(optarg)+1);
				strcpy(first_file,optarg);
				break;

			case '2':
				second_file = (char*) malloc(strlen(optarg)+1);
				strcpy(second_file,optarg);
				break;

			case 'a':
				a_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(a_output_file,optarg);
				break;

			case 'b':
				b_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(b_output_file,optarg);
				break;

			case 'c':
				c_output_file = (char*) malloc(strlen(optarg)+1);
				strcpy(c_output_file,optarg);
				break;

			default:
				abort ();
		}
	}

	/* Instead of reporting '--verbose'
	   and '--brief' as they are encountered,
	   we report the final status resulting from them. */
	if (verbose_flag) {
		fprintf(stderr, "verbose flag is set\n");
		fprintf(stderr,"First file is %s\n", first_file);
		fprintf(stderr,"Second file is %s\n", second_file);
		if (a_output_file != NULL && a_output_file != NULL && a_output_file != NULL) {
			fprintf(stderr, "Output will be written to files:\n");
			fprintf(stderr, "  first file uniques: %s\n", a_output_file);
			fprintf(stderr, "  second file uniques: %s\n", b_output_file);
			fprintf(stderr, "  common to both input files: %s\n", c_output_file);
		} else
			fprintf(stderr,"No output files will be generated\n");

		if (use_header)
			fprintf(stderr,"Processing will be done using headers, not sequences\n");
		else
			fprintf(stderr,"Processing will be done using sequences\n");
		if (only_summarize)
			fprintf(stderr,"Only showing summary information\n");
	}

	/* check validity of given argument combination */
	if (! first_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	if (! second_file) {
		fprintf (stderr, "Error: First sequence file is required.\n");
		return EXIT_FAILURE;
	}

	results->first_file = first_file;
	results->second_file = second_file;
	results->use_header = use_header;
	results->only_summarize = only_summarize;
	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		results->a_output_fp = fopen(a_output_file,"w+");
		if (!results->a_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,a_output_file);
			exit(EXIT_FAILURE);
		}
		results->b_output_fp = fopen(b_output_file,"w+");
		if (!results->b_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,b_output_file);
			exit(EXIT_FAILURE);
		}
		results->c_output_fp = fopen(c_output_file,"w+");
		if (!results->c_output_fp) {
			fprintf(stderr,"%s - failed to open file %s\n",progname,c_output_file);
			exit(EXIT_FAILURE);
		}
	}

	/* do the comparison */
	cmpseq(results);

	if (a_output_file != NULL && b_output_file != NULL && c_output_file != NULL) {
		fclose(results->a_output_fp);
		fclose(results->b_output_fp);
		fclose(results->c_output_fp);
	}

	/* report results */
	fprintf(stderr, " first_file_total = %d\n", results->first_file_total);
	fprintf(stderr, "  first_file_uniq = %d\n", results->first_file_uniq);
	fprintf(stderr, "second_file_total = %d\n", results->second_file_total);
	fprintf(stderr, " second_file_uniq = %d\n", results->second_file_uniq);
	fprintf(stderr, "           common = %d\n",           results->common);

	free(first_file);
	free(second_file);
	if (a_output_file != NULL)
		free(a_output_file);
	if (b_output_file != NULL)
		free(b_output_file);
	if (c_output_file != NULL)
		free(c_output_file);

	/* clean up */
	seqdiff_results_destroy(results);
	fclose(stderr);
	fclose(stdout);
	fclose(stdin);
	return EXIT_SUCCESS;
}